

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int parse_expression_list(ParserState *parser,AstNodeList **list)

{
  LexerState *ls_00;
  int iVar1;
  AstNode *pAVar2;
  AstNode *expr;
  int n;
  LexerState *ls;
  AstNodeList **list_local;
  ParserState *parser_local;
  
  ls_00 = parser->ls;
  expr._4_4_ = 1;
  pAVar2 = parse_expression(parser);
  add_ast_node(parser->compiler_state,list,pAVar2);
  while( true ) {
    iVar1 = testnext(ls_00,0x2c);
    if (iVar1 == 0) break;
    pAVar2 = parse_expression(parser);
    add_ast_node(parser->compiler_state,list,pAVar2);
    expr._4_4_ = expr._4_4_ + 1;
  }
  return expr._4_4_;
}

Assistant:

static int parse_expression_list(ParserState *parser, AstNodeList **list)
{
	LexerState *ls = parser->ls;
	/* explist -> expr { ',' expr } */
	int n = 1; /* at least one expression */
	AstNode *expr = parse_expression(parser);
	add_ast_node(parser->compiler_state, list, expr);
	while (testnext(ls, ',')) {
		expr = parse_expression(parser);
		add_ast_node(parser->compiler_state, list, expr);
		n++;
	}
	return n;
}